

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_6::VisitPrimsRec
               (Path *root_abs_path,Prim *root,int32_t level,VisitPrimFunction visitor_fun,
               void *userdata,string *err)

{
  Prim *pPVar1;
  pointer pTVar2;
  long lVar3;
  string *psVar4;
  bool bVar5;
  PrimMeta *pPVar6;
  iterator iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Prim *child;
  Prim *root_00;
  long lVar8;
  ulong uVar9;
  token nameTok;
  string fun_error;
  Path child_abs_path;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  undefined1 local_1a8 [32];
  string *local_188;
  VisitPrimFunction local_180;
  void *local_178;
  string local_170;
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0 [2];
  optional<tinyusdz::Path::PathType> local_80;
  _Rb_tree_node_base local_78;
  undefined8 local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  local_180 = visitor_fun;
  local_178 = userdata;
  bVar5 = (*visitor_fun)(root_abs_path,root,level,userdata,&local_170);
  if (bVar5) {
    pPVar6 = Prim::metas(root);
    root_00 = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((long)(pPVar6->primChildren).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pPVar6->primChildren).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 5 ==
        ((long)pPVar1 - (long)root_00 >> 4) * 0x21cfb2b78c13521d) {
      local_78._M_left = &local_78;
      local_78._M_color = _S_red;
      local_78._M_parent = (_Base_ptr)0x0;
      local_58 = 0;
      local_188 = err;
      local_78._M_right = local_78._M_left;
      if (pPVar1 != root_00) {
        lVar8 = 0;
        uVar9 = 0;
        do {
          local_150._0_8_ = (long)&(root_00->_abs_path)._prim_part._M_dataplus._M_p + lVar8;
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                      *)&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(root_00->_elementPath)._prim_part._M_dataplus._M_p + lVar8),
                     (Prim **)local_150);
          uVar9 = uVar9 + 1;
          root_00 = (root->_children).
                    super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 0x350;
        } while (uVar9 < (ulong)(((long)(root->_children).
                                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)root_00
                                 >> 4) * 0x21cfb2b78c13521d));
      }
      pPVar6 = Prim::metas(root);
      if ((pPVar6->primChildren).
          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pPVar6->primChildren).
          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar8 = 8;
        uVar9 = 0;
        do {
          pPVar6 = Prim::metas(root);
          pTVar2 = (pPVar6->primChildren).
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_start;
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1a8 + 0x10);
          lVar3 = *(long *)((long)pTVar2 + lVar8 + -8);
          local_1a8._0_8_ = args;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,lVar3,
                     *(long *)((long)&(pTVar2->str_)._M_dataplus._M_p + lVar8) + lVar3);
          iVar7 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                          *)&local_80,(key_type *)local_1a8);
          psVar4 = local_188;
          if (iVar7._M_node == &local_78) {
            if (local_188 != (string *)0x0) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,
                         "Prim name `{}` in `primChildren` metadatum not found in this Prim\'s children"
                         ,"");
              fmt::format<std::__cxx11::string>
                        ((string *)local_150,(fmt *)&local_50,(string *)local_1a8,args);
              ::std::__cxx11::string::_M_append((char *)psVar4,local_150._0_8_);
              if ((Prim *)local_150._0_8_ != (Prim *)(local_150 + 0x10)) {
                operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1a8 + 0x10)) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
LAB_00313736:
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                        *)&local_80,(_Link_type)local_78._M_parent);
            bVar5 = false;
            goto LAB_0031374f;
          }
          Path::AppendPrim((Path *)local_150,root_abs_path,(key_type *)local_1a8);
          bVar5 = VisitPrimsRec((Path *)local_150,*(Prim **)(iVar7._M_node + 2),level + 1,local_180,
                                local_178,local_188);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_p != local_a0) {
            operator_delete(local_b0._M_p,local_a0[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_p != &local_c0) {
            operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_p != &local_e0) {
            operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_p != &local_100) {
            operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_p != &local_120) {
            operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
          }
          if ((Prim *)local_150._0_8_ != (Prim *)(local_150 + 0x10)) {
            operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (!bVar5) goto LAB_00313736;
          uVar9 = uVar9 + 1;
          pPVar6 = Prim::metas(root);
          lVar8 = lVar8 + 0x20;
        } while (uVar9 < (ulong)((long)(pPVar6->primChildren).
                                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pPVar6->primChildren).
                                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                  *)&local_80,(_Link_type)local_78._M_parent);
      bVar5 = true;
    }
    else if (root_00 == pPVar1) {
      bVar5 = true;
    }
    else {
      do {
        Path::AppendPrim((Path *)local_150,root_abs_path,&(root_00->_elementPath)._prim_part);
        bVar5 = VisitPrimsRec((Path *)local_150,root_00,level + 1,local_180,local_178,err);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_p != local_a0) {
          operator_delete(local_b0._M_p,local_a0[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_p != &local_c0) {
          operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p != &local_e0) {
          operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_p != &local_100) {
          operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
        }
        if ((Prim *)local_150._0_8_ != (Prim *)(local_150 + 0x10)) {
          operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
        }
        root_00 = root_00 + 1;
      } while (bVar5 && root_00 != pPVar1);
    }
  }
  else {
    bVar5 = false;
    if ((err != (string *)0x0) && (local_170._M_string_length != 0)) {
      local_80 = (optional<tinyusdz::Path::PathType>)&local_78._M_parent;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,
                 "Visit function returned an error for Prim {} (id {}). err = {}","");
      Path::full_path_name_abi_cxx11_((string *)local_1a8,root_abs_path);
      local_50._M_dataplus._M_p = (pointer)root->_prim_id;
      fmt::format<std::__cxx11::string,long,std::__cxx11::string>
                ((string *)local_150,(fmt *)&local_80,(string *)local_1a8,&local_50,
                 (long *)&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)visitor_fun);
      ::std::__cxx11::string::_M_append((char *)err,local_150._0_8_);
      if ((Prim *)local_150._0_8_ != (Prim *)(local_150 + 0x10)) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_80 != (optional<tinyusdz::Path::PathType>)&local_78._M_parent) {
        operator_delete((void *)local_80,
                        (ulong)((long)&((_Rb_tree_node_base *)&(local_78._M_parent)->_M_color)->
                                       _M_color + 1));
      }
      bVar5 = false;
    }
  }
LAB_0031374f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool VisitPrimsRec(const tinyusdz::Path &root_abs_path,
                   const tinyusdz::Prim &root, int32_t level,
                   VisitPrimFunction visitor_fun, void *userdata,
                   std::string *err) {
  std::string fun_error;
  bool ret = visitor_fun(root_abs_path, root, level, userdata, &fun_error);
  if (!ret) {
    if (fun_error.empty()) {
      // early termination request.
      DCOUT("Early termination requested");
    } else {
      if (err) {
        (*err) += fmt::format(
            "Visit function returned an error for Prim {} (id {}). err = {}",
            root_abs_path.full_path_name(), root.prim_id(), fun_error);
      }
    }
    return false;
  }

  // if `primChildren` is available, use it
  if (root.metas().primChildren.size() == root.children().size()) {
    std::map<std::string, const Prim *> primNameTable;
    for (size_t i = 0; i < root.children().size(); i++) {
      primNameTable.emplace(root.children()[i].element_name(),
                            &root.children()[i]);
    }

    for (size_t i = 0; i < root.metas().primChildren.size(); i++) {
      value::token nameTok = root.metas().primChildren[i];
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        const Path child_abs_path = root_abs_path.AppendPrim(nameTok.str());
        if (!VisitPrimsRec(child_abs_path, *it->second, level + 1, visitor_fun,
                           userdata, err)) {
          return false;
        }
      } else {
        if (err) {
          (*err) += fmt::format(
              "Prim name `{}` in `primChildren` metadatum not found in this "
              "Prim's children",
              nameTok.str());
        }
        return false;
      }
    }

  } else {
    for (const auto &child : root.children()) {
      const Path child_abs_path =
          root_abs_path.AppendPrim(child.element_name());
      if (!VisitPrimsRec(child_abs_path, child, level + 1, visitor_fun,
                         userdata, err)) {
        return false;
      }
    }
  }

  return true;
}